

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_corner_table.cc
# Opt level: O0

bool __thiscall
draco::MeshAttributeCornerTable::InitEmpty(MeshAttributeCornerTable *this,CornerTable *table)

{
  pointer in_RSI;
  ValenceCache<draco::MeshAttributeCornerTable> *in_RDI;
  bool bVar1;
  size_type in_stack_ffffffffffffffb8;
  pointer *__n;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffc0;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int> *this_00;
  ValenceCache<draco::MeshAttributeCornerTable> *this_01;
  
  bVar1 = in_RSI != (pointer)0x0;
  if (bVar1) {
    this_01 = in_RDI;
    ValenceCache<draco::MeshAttributeCornerTable>::ClearValenceCache(in_RDI);
    ValenceCache<draco::MeshAttributeCornerTable>::ClearValenceCacheInaccurate(this_01);
    CornerTable::num_corners((CornerTable *)0x190436);
    std::vector<bool,_std::allocator<bool>_>::assign
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(bool *)0x19044d);
    __n = &(in_RDI->vertex_valence_cache_32_bit_).vector_.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
    CornerTable::num_vertices((CornerTable *)0x190464);
    std::vector<bool,_std::allocator<bool>_>::assign
              (in_stack_ffffffffffffffc0,(size_type)__n,(bool *)0x19047a);
    this_00 = &in_RDI[1].vertex_valence_cache_32_bit_;
    CornerTable::num_corners((CornerTable *)0x190492);
    std::
    vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
    ::assign((vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
              *)this_00,(size_type)__n,(value_type *)0x1904a6);
    CornerTable::num_vertices((CornerTable *)0x1904c0);
    std::
    vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
    ::reserve((vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
               *)this_01,(size_type)in_RSI);
    CornerTable::num_vertices((CornerTable *)0x1904e5);
    std::
    vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ::reserve((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               *)this_01,(size_type)in_RSI);
    in_RDI[2].vertex_valence_cache_32_bit_.vector_.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = in_RSI;
    *(undefined1 *)
     &in_RDI[1].vertex_valence_cache_8_bit_.vector_.
      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = 1;
  }
  return bVar1;
}

Assistant:

bool MeshAttributeCornerTable::InitEmpty(const CornerTable *table) {
  if (table == nullptr) {
    return false;
  }
  valence_cache_.ClearValenceCache();
  valence_cache_.ClearValenceCacheInaccurate();
  is_edge_on_seam_.assign(table->num_corners(), false);
  is_vertex_on_seam_.assign(table->num_vertices(), false);
  corner_to_vertex_map_.assign(table->num_corners(), kInvalidVertexIndex);
  vertex_to_attribute_entry_id_map_.reserve(table->num_vertices());
  vertex_to_left_most_corner_map_.reserve(table->num_vertices());
  corner_table_ = table;
  no_interior_seams_ = true;
  return true;
}